

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O0

void __thiscall
InsertProxyModelPrivate::checkExtraDataChanged
          (InsertProxyModelPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight,
          QVector<int> *roles)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  InsertProxyModel *pIVar5;
  long *plVar6;
  ulong uVar7;
  int sourceRows;
  int sourceCols;
  undefined1 local_48 [8];
  QModelIndex mappedParent;
  InsertProxyModel *q;
  QVector<int> *roles_local;
  QModelIndex *bottomRight_local;
  QModelIndex *topLeft_local;
  InsertProxyModelPrivate *this_local;
  
  pIVar5 = q_func(this);
  mappedParent.m = (QAbstractItemModel *)pIVar5;
  QModelIndex::parent((QModelIndex *)&sourceRows,topLeft);
  (**(code **)(*(long *)pIVar5 + 400))(local_48,pIVar5,&sourceRows);
  plVar6 = (long *)QAbstractProxyModel::sourceModel();
  iVar2 = (**(code **)(*plVar6 + 0x80))(plVar6,local_48);
  plVar6 = (long *)QAbstractProxyModel::sourceModel();
  iVar3 = (**(code **)(*plVar6 + 0x78))(plVar6,local_48);
  bVar1 = QModelIndex::operator==(topLeft,bottomRight);
  if (((!bVar1) || (iVar4 = QModelIndex::column(bottomRight), iVar4 < iVar2)) ||
     (iVar4 = QModelIndex::row(bottomRight), iVar4 < iVar3)) {
    iVar4 = QModelIndex::column(bottomRight);
    if (iVar4 < iVar2) {
      iVar2 = QModelIndex::row(bottomRight);
      if ((iVar3 <= iVar2) &&
         (uVar7 = (**(code **)(*(long *)mappedParent.m + 0x1c0))(), (uVar7 & 1) != 0)) {
        commitRow(this);
      }
    }
    else {
      uVar7 = (**(code **)(*(long *)mappedParent.m + 0x1c8))();
      if ((uVar7 & 1) != 0) {
        commitColumn(this);
      }
    }
  }
  return;
}

Assistant:

void InsertProxyModelPrivate::checkExtraDataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight, const QVector<int> &roles)
{
    Q_UNUSED(roles)
    Q_ASSERT(topLeft.isValid());
    Q_ASSERT(bottomRight.isValid());
    Q_Q(InsertProxyModel);
    Q_ASSERT(topLeft.model() == q);
    Q_ASSERT(bottomRight.model() == q);
    Q_ASSERT(topLeft.row() <= bottomRight.row());
    Q_ASSERT(topLeft.column() <= bottomRight.column());
    Q_ASSERT(topLeft.parent() == bottomRight.parent());
    const QModelIndex mappedParent = q->mapToSource(topLeft.parent());
    const int sourceCols = q->sourceModel()->columnCount(mappedParent);
    const int sourceRows = q->sourceModel()->rowCount(mappedParent);
    if (topLeft == bottomRight && bottomRight.column() >= sourceCols && bottomRight.row() >= sourceRows)
        return; // the corner changed
    if (bottomRight.column() >= sourceCols) {
        if (q->validColumn())
            commitColumn();
    } else if (bottomRight.row() >= sourceRows) {
        if (q->validRow())
            commitRow();
    }
}